

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O2

void cal_dataReady(stringstream *st)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  istream *piVar4;
  istream *piVar5;
  mapped_type *pmVar6;
  int i_1;
  uint uVar7;
  int iVar8;
  int i;
  long lVar9;
  uint uVar10;
  int i_2;
  int iVar11;
  int tmpNum;
  int ifFighterOnly;
  int tmpAvailBit;
  int leastAttackerSz;
  int planeTypeNum;
  uint local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  string tmpName;
  
  pfVar3 = (float *)std::istream::operator>>((istream *)st,&tarAirSupremacy);
  piVar4 = std::istream::_M_extract<float>(pfVar3);
  piVar4 = std::istream::_M_extract<float>((float *)piVar4);
  piVar5 = (istream *)std::istream::operator>>((istream *)piVar4,&leastAttackerSz);
  piVar5 = (istream *)std::istream::operator>>(piVar5,&armor);
  std::istream::operator>>(piVar5,&nearing_coef);
  armor_max = (int)((double)armor * 1.3333333333333333);
  armor_min = (int)((double)armor * 0.6666666666666666);
  std::istream::operator>>((istream *)st,&carrierNum);
  tmpName._M_dataplus._M_p = (pointer)&tmpName.field_2;
  tmpName._M_string_length = 0;
  tmpName.field_2._M_local_buf[0] = '\0';
  for (lVar9 = 0; lVar9 < carrierNum; lVar9 = lVar9 + 1) {
    piVar4 = std::operator>>((istream *)st,(string *)&tmpName);
    piVar5 = (istream *)std::istream::operator>>((istream *)piVar4,&tmpAvailBit);
    std::istream::operator>>(piVar5,&ifFighterOnly);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&carriers_m_abi_cxx11_,&tmpName);
    iVar8 = *pmVar6;
    uVar10 = carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
             super__Vector_impl_data._M_start[iVar8].gridNum;
    std::vector<Carrier,_std::allocator<Carrier>_>::push_back
              (&theCarrier,
               carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
               super__Vector_impl_data._M_start + iVar8);
    uVar7 = 1 << (4U - (char)uVar10 & 0x1f);
    availGrid[lVar9] = 0;
    while (0 < (int)uVar10) {
      uVar1 = uVar10 - 1;
      if ((tmpAvailBit & uVar7) != 0) {
        local_60 = carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8].gridSize[uVar1];
        local_5c = (int)((double)local_60 * *(double *)(&DAT_0010e1b0 + (ulong)(uVar10 == 1) * 8));
        local_58 = carriers.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8].atk;
        planeTypeNum = (int)lVar9;
        local_54 = (uint)(local_60 < leastAttackerSz || ifFighterOnly != 0);
        local_64 = uVar1;
        std::vector<Grid,_std::allocator<Grid>_>::emplace_back<Grid>(&gridVec,(Grid *)&planeTypeNum)
        ;
        if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1].isFighterOnly == 0) {
          availGrid[lVar9] = availGrid[lVar9] + 1;
          attackerAbleGridNum = attackerAbleGridNum + 1;
        }
      }
      uVar7 = uVar7 * 2;
      uVar10 = uVar1;
    }
  }
  std::istream::operator>>((istream *)st,&planeTypeNum);
  for (iVar8 = 0; iVar8 < planeTypeNum; iVar8 = iVar8 + 1) {
    std::operator>>((istream *)st,(string *)&tmpName);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&planes_m_abi_cxx11_,&tmpName);
    iVar2 = *pmVar6;
    std::istream::operator>>((istream *)st,&tmpNum);
    for (iVar11 = 0; iVar11 < tmpNum; iVar11 = iVar11 + 1) {
      std::vector<Plane,_std::allocator<Plane>_>::push_back
                (&planeVec,
                 planes.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar2);
    }
  }
  std::__cxx11::string::~string((string *)&tmpName);
  return;
}

Assistant:

void cal_dataReady(stringstream &st){//��query������Ҫ����
    int leastAttackerSz;
    st>>tarAirSupremacy>>op_coef>>accu_coef>>leastAttackerSz>>armor>>nearing_coef;

    armor_max=armor*(4.0/3);
    armor_min=armor*(2.0/3);
    //read carrier
    st>>carrierNum;
    string tmpName;
    int tmpAvailBit,ifFighterOnly;
    for(int i=0;i<carrierNum;i++){
        st>>tmpName>>tmpAvailBit>>ifFighterOnly;
        int tmpCarrierID=carriers_m[tmpName];
        int tmpCarrierGridNum=carriers[tmpCarrierID].gridNum;
        theCarrier.push_back(carriers[tmpCarrierID]);
        int bit=1<<(4-tmpCarrierGridNum);
        //insert grid
        availGrid[i]=0;

        for(int j=tmpCarrierGridNum-1;j>=0;j--){
            if(tmpAvailBit&bit){//bit arithmatic judge if the grid available
                int &tmpGridSize=carriers[tmpCarrierID].gridSize[j];
                gridVec.push_back(Grid(i,j,tmpGridSize, tmpGridSize*(j==0?FIRST_SLOT_BUFF:1),carriers[tmpCarrierID].atk,checkIfFighterOnly(tmpGridSize,leastAttackerSz,ifFighterOnly)));
                if(!gridVec.back().isFighterOnly){
                    availGrid[i]++;
                    attackerAbleGridNum++;
                }
            }
            bit<<=1;
        }
    }

    //read plane
    int planeTypeNum;
    st>>planeTypeNum;
    for(int i=0;i<planeTypeNum;i++){
        st>>tmpName;
        int tmpPlaneID=planes_m[tmpName];
        int tmpNum;
        st>>tmpNum;
        for(int i=0;i<tmpNum;i++)
            planeVec.push_back(planes[tmpPlaneID]);
    }
}